

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<const_slang::ast::Symbol_*&>::streamReconstructedExpression
          (UnaryExpr<const_slang::ast::Symbol_*&> *this,ostream *os)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Symbol **in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<slang::ast::Symbol_const*>(in_stack_ffffffffffffffa8);
  std::operator<<((ostream *)in_RSI,local_30);
  std::__cxx11::string::~string(in_RSI);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }